

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-impl.cpp
# Opt level: O0

string * gguf_data_to_str_abi_cxx11_(gguf_type type,void *data,int i)

{
  undefined4 in_ECX;
  char *in_RDX;
  uint in_ESI;
  string *in_RDI;
  undefined8 in_stack_ffffffffffffffa8;
  uint in_stack_ffffffffffffffdc;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_fffffffffffffff0;
  int __val;
  
  __val = (int)((ulong)in_RDI >> 0x20);
  switch(in_ESI) {
  case 0:
    std::__cxx11::to_string(__val);
    break;
  case 1:
    std::__cxx11::to_string(__val);
    break;
  case 2:
    std::__cxx11::to_string(__val);
    break;
  case 3:
    std::__cxx11::to_string(__val);
    break;
  case 4:
    std::__cxx11::to_string(in_stack_ffffffffffffffdc);
    break;
  case 5:
    std::__cxx11::to_string(__val);
    break;
  case 6:
    std::__cxx11::to_string((float)((ulong)in_stack_ffffffffffffffa8 >> 0x20));
    break;
  case 7:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_ESI,in_stack_fffffffffffffff0),in_RDX,
               (allocator<char> *)CONCAT44(in_ECX,in_stack_ffffffffffffffe0));
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffe3);
    break;
  default:
    format_abi_cxx11_((char *)in_RDI,"unknown type %d",(ulong)in_ESI);
    break;
  case 10:
    std::__cxx11::to_string((unsigned_long)in_RDX);
    break;
  case 0xb:
    std::__cxx11::to_string((long)in_RDI);
    break;
  case 0xc:
    std::__cxx11::to_string((double)in_RDI);
  }
  return in_RDI;
}

Assistant:

static std::string gguf_data_to_str(enum gguf_type type, const void * data, int i) {
    switch (type) {
        case GGUF_TYPE_UINT8:   return std::to_string(((const uint8_t  *)data)[i]);
        case GGUF_TYPE_INT8:    return std::to_string(((const int8_t   *)data)[i]);
        case GGUF_TYPE_UINT16:  return std::to_string(((const uint16_t *)data)[i]);
        case GGUF_TYPE_INT16:   return std::to_string(((const int16_t  *)data)[i]);
        case GGUF_TYPE_UINT32:  return std::to_string(((const uint32_t *)data)[i]);
        case GGUF_TYPE_INT32:   return std::to_string(((const int32_t  *)data)[i]);
        case GGUF_TYPE_UINT64:  return std::to_string(((const uint64_t *)data)[i]);
        case GGUF_TYPE_INT64:   return std::to_string(((const int64_t  *)data)[i]);
        case GGUF_TYPE_FLOAT32: return std::to_string(((const float    *)data)[i]);
        case GGUF_TYPE_FLOAT64: return std::to_string(((const double   *)data)[i]);
        case GGUF_TYPE_BOOL:    return ((const bool *)data)[i] ? "true" : "false";
        default:                return format("unknown type %d", type);
    }
}